

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O2

void __thiscall
slang::ast::PrimitiveSymbol::PrimitiveSymbol
          (PrimitiveSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          PrimitiveKind primitiveKind)

{
  (this->super_Symbol).kind = Primitive;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  *(undefined8 *)((long)&(this->table)._M_extent._M_extent_value + 2) = 0;
  *(undefined8 *)((long)&this->initVal + 2) = 0;
  (this->table)._M_ptr = (pointer)0x0;
  (this->table)._M_extent._M_extent_value = 0;
  (this->ports)._M_ptr = (pointer)0x0;
  (this->ports)._M_extent._M_extent_value = 0;
  this->primitiveKind = primitiveKind;
  return;
}

Assistant:

PrimitiveSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                    PrimitiveKind primitiveKind) :
        Symbol(SymbolKind::Primitive, name, loc), Scope(compilation, this),
        primitiveKind(primitiveKind) {}